

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::fulfill
          (Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this,
          FixVoid<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *value)

{
  ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> local_1e8;
  
  if ((this->super_CoroutineBase).waiting == true) {
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::ExceptionOr
              (&local_1e8,value);
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::operator=
              (&this->result,&local_1e8);
    if (local_1e8.value.ptr.isSet == true) {
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
                (&local_1e8.value.ptr.field_1.value);
    }
    if (local_1e8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1e8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_CoroutineBase).onReadyEvent);
    (this->super_CoroutineBase).waiting = false;
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }